

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound::AudioFeaturePrint_Sound
          (AudioFeaturePrint_Sound *this,AudioFeaturePrint_Sound *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__AudioFeaturePrint_Sound_00424fc0
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->version_ = from->version_;
  return;
}

Assistant:

AudioFeaturePrint_Sound::AudioFeaturePrint_Sound(const AudioFeaturePrint_Sound& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  version_ = from.version_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.AudioFeaturePrint.Sound)
}